

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * __thiscall RPCArg::GetName_abi_cxx11_(string *__return_storage_ptr__,RPCArg *this)

{
  size_t __n;
  pointer pcVar1;
  void *pvVar2;
  long in_FS_OFFSET;
  bool local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  __n = (this->m_names)._M_string_length;
  if (__n == 0) {
    local_21 = true;
  }
  else {
    pcVar1 = (this->m_names)._M_dataplus._M_p;
    pvVar2 = memchr(pcVar1,0x7c,__n);
    local_21 = (long)pvVar2 - (long)pcVar1 == -1 || pvVar2 == (void *)0x0;
  }
  inline_check_non_fatal<bool>
            (&local_21,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
             ,0x39c,"GetName","std::string::npos == m_names.find(\'|\')");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_names)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->m_names)._M_string_length);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string RPCArg::GetName() const
{
    CHECK_NONFATAL(std::string::npos == m_names.find('|'));
    return m_names;
}